

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_hrec_destroy(bcf_hrec_t *hrec)

{
  int local_14;
  int i;
  bcf_hrec_t *hrec_local;
  
  free(hrec->key);
  if (hrec->value != (char *)0x0) {
    free(hrec->value);
  }
  for (local_14 = 0; local_14 < hrec->nkeys; local_14 = local_14 + 1) {
    free(hrec->keys[local_14]);
    free(hrec->vals[local_14]);
  }
  free(hrec->keys);
  free(hrec->vals);
  free(hrec);
  return;
}

Assistant:

void bcf_hrec_destroy(bcf_hrec_t *hrec)
{
    free(hrec->key);
    if ( hrec->value ) free(hrec->value);
    int i;
    for (i=0; i<hrec->nkeys; i++)
    {
        free(hrec->keys[i]);
        free(hrec->vals[i]);
    }
    free(hrec->keys);
    free(hrec->vals);
    free(hrec);
}